

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alprd.hpp
# Opt level: O3

void duckdb::alp::AlpRDCompression<double,_false>::Compress
               (EXACT_TYPE *input_vector,idx_t n_values,State *state)

{
  ushort uVar1;
  byte bVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  unsigned_long uVar5;
  idx_t iVar6;
  ulong uVar7;
  ulong uVar8;
  int remainder;
  uint uVar9;
  uint16_t *in;
  uint64_t *in_00;
  uint bit;
  idx_t i;
  ulong uVar10;
  ulong uVar11;
  idx_t misaligned_count;
  uint16_t dictionary_key;
  uint16_t left_parts [1024];
  uint64_t right_parts [1024];
  byte local_2969;
  idx_t local_2960;
  ulong local_2958;
  uint64_t local_2938 [4];
  uint16_t local_2918 [112];
  uint16_t local_2838 [1024];
  uint64_t local_2038 [1025];
  
  bVar2 = state->right_bit_width;
  if (n_values != 0) {
    iVar6 = 0;
    do {
      uVar7 = input_vector[iVar6];
      local_2038[iVar6] = uVar7 & ~(-1L << (bVar2 & 0x3f));
      local_2838[iVar6] = (uint16_t)(uVar7 >> (bVar2 & 0x3f));
      iVar6 = iVar6 + 1;
    } while (n_values != iVar6);
    iVar6 = 0;
    do {
      local_2938[0]._0_2_ = local_2838[iVar6];
      iVar3 = ::std::
              _Hashtable<unsigned_short,_std::pair<const_unsigned_short,_unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(state->left_parts_dict_map)._M_h,(key_type_conflict3 *)local_2938);
      if (iVar3.super__Node_iterator_base<std::pair<const_unsigned_short,_unsigned_short>,_false>.
          _M_cur == (__node_type *)0x0) {
        local_2838[iVar6] = (ushort)state->actual_dictionary_size;
LAB_005ac7c7:
        uVar1 = state->exceptions_count;
        state->exceptions[uVar1] = (uint16_t)local_2938[0];
        state->exceptions_positions[uVar1] = (uint16_t)iVar6;
        state->exceptions_count = uVar1 + 1;
      }
      else {
        pmVar4 = ::std::__detail::
                 _Map_base<unsigned_short,_std::pair<const_unsigned_short,_unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_short,_std::pair<const_unsigned_short,_unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&state->left_parts_dict_map,(key_type *)local_2938);
        uVar1 = *pmVar4;
        bVar2 = state->actual_dictionary_size;
        local_2838[iVar6] = uVar1;
        if (bVar2 <= uVar1) goto LAB_005ac7c7;
      }
      iVar6 = iVar6 + 1;
    } while (n_values != iVar6);
    bVar2 = state->right_bit_width;
    uVar9 = (uint)n_values & 0x1f;
    if ((n_values & 0x1f) != 0) {
      uVar5 = NumericCastImpl<unsigned_long,_int,_false>::Convert(uVar9);
      local_2958 = ((n_values + 0x20) - uVar5) * (ulong)bVar2;
      local_2969 = state->left_bit_width;
      uVar5 = NumericCastImpl<unsigned_long,_int,_false>::Convert(uVar9);
      local_2960 = (n_values + 0x20) - uVar5;
      bVar2 = state->left_bit_width;
      goto LAB_005ac855;
    }
  }
  local_2958 = bVar2 * n_values;
  bVar2 = state->left_bit_width;
  local_2969 = bVar2;
  local_2960 = n_values;
LAB_005ac855:
  uVar9 = (uint)n_values & 0x1f;
  uVar11 = (ulong)bVar2;
  uVar7 = n_values & 0xffffffffffffffe0;
  if (uVar7 != 0) {
    in = local_2838;
    uVar8 = 0;
    uVar10 = 0;
    do {
      duckdb_fastpforlib::internal::fastpack_half
                (in,(uint16_t *)(state->left_parts_encoded + (uVar8 >> 3)),(uint)bVar2);
      duckdb_fastpforlib::internal::fastpack_half
                (in + 0x10,(uint16_t *)(state->left_parts_encoded + (uVar8 >> 3) + uVar11 * 2),
                 (uint)bVar2);
      uVar10 = uVar10 + 0x20;
      in = in + 0x20;
      uVar8 = uVar8 + (ulong)bVar2 * 0x20;
    } while (uVar10 < uVar7);
  }
  if ((n_values & 0x1f) != 0) {
    uVar8 = (ulong)(uVar9 * 2);
    switchD_005681f0::default((void *)((long)local_2938 + uVar8),0,0x40 - uVar8);
    switchD_00b03519::default(local_2938,local_2838 + uVar7,uVar8);
    duckdb_fastpforlib::internal::fastpack_half
              ((uint16_t *)local_2938,
               (uint16_t *)(state->left_parts_encoded + (uVar7 * uVar11 >> 3)),(uint)bVar2);
    duckdb_fastpforlib::internal::fastpack_half
              (local_2918,
               (uint16_t *)(state->left_parts_encoded + (uVar7 * uVar11 >> 3) + uVar11 * 2),
               (uint)bVar2);
  }
  bVar2 = state->right_bit_width;
  bit = (uint)bVar2;
  if (uVar7 != 0) {
    in_00 = local_2038;
    uVar11 = 0;
    uVar8 = 0;
    do {
      duckdb_fastpforlib::fastpack
                (in_00,(uint32_t *)(state->right_parts_encoded + (uVar11 >> 3)),bit);
      uVar8 = uVar8 + 0x20;
      in_00 = in_00 + 0x20;
      uVar11 = uVar11 + (ulong)bVar2 * 0x20;
    } while (uVar8 < uVar7);
  }
  if ((n_values & 0x1f) != 0) {
    uVar11 = (ulong)(uVar9 << 3);
    switchD_005681f0::default((void *)((long)local_2938 + uVar11),0,0x100 - uVar11);
    switchD_00b03519::default(local_2938,local_2038 + uVar7,uVar11);
    duckdb_fastpforlib::fastpack
              (local_2938,(uint32_t *)(state->right_parts_encoded + (bit * uVar7 >> 3)),bit);
  }
  state->left_bit_packed_size = local_2960 * local_2969 >> 3;
  state->right_bit_packed_size = local_2958 >> 3;
  return;
}

Assistant:

static void Compress(const EXACT_TYPE *input_vector, idx_t n_values, State &state) {

		uint64_t right_parts[AlpRDConstants::ALP_VECTOR_SIZE];
		uint16_t left_parts[AlpRDConstants::ALP_VECTOR_SIZE];

		// Cutting the floating point values
		for (idx_t i = 0; i < n_values; i++) {
			EXACT_TYPE tmp = input_vector[i];
			right_parts[i] = tmp & ((1ULL << state.right_bit_width) - 1);
			left_parts[i] = UnsafeNumericCast<uint16_t>(tmp >> state.right_bit_width);
		}

		// Dictionary encoding for left parts
		for (idx_t i = 0; i < n_values; i++) {
			uint16_t dictionary_index;
			auto dictionary_key = left_parts[i];
			if (state.left_parts_dict_map.find(dictionary_key) == state.left_parts_dict_map.end()) {
				//! If not found on the dictionary we store the smallest non-key index as exception (the dict size)
				dictionary_index = state.actual_dictionary_size;
			} else {
				dictionary_index = state.left_parts_dict_map[dictionary_key];
			}
			left_parts[i] = dictionary_index;

			//! Left parts not found in the dictionary are stored as exceptions
			if (dictionary_index >= state.actual_dictionary_size) {
				state.exceptions[state.exceptions_count] = dictionary_key;
				state.exceptions_positions[state.exceptions_count] = UnsafeNumericCast<uint16_t>(i);
				state.exceptions_count++;
			}
		}

		auto right_bit_packed_size = BitpackingPrimitives::GetRequiredSize(n_values, state.right_bit_width);
		auto left_bit_packed_size = BitpackingPrimitives::GetRequiredSize(n_values, state.left_bit_width);

		if (!EMPTY) {
			// Bitpacking Left and Right parts
			BitpackingPrimitives::PackBuffer<uint16_t, false>(state.left_parts_encoded, left_parts, n_values,
			                                                  state.left_bit_width);
			BitpackingPrimitives::PackBuffer<uint64_t, false>(state.right_parts_encoded, right_parts, n_values,
			                                                  state.right_bit_width);
		}

		state.left_bit_packed_size = left_bit_packed_size;
		state.right_bit_packed_size = right_bit_packed_size;
	}